

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O1

void __thiscall QSupportedWritingSystems::detach(QSupportedWritingSystems *this)

{
  QWritingSystemsPrivate *pQVar1;
  Data *pDVar2;
  QWritingSystemsPrivate *pQVar3;
  
  pQVar1 = this->d;
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 1) {
    pQVar3 = (QWritingSystemsPrivate *)operator_new(0x20);
    (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pDVar2 = (pQVar1->list).d.d;
    (pQVar3->list).d.d = pDVar2;
    (pQVar3->list).d.ptr = (pQVar1->list).d.ptr;
    (pQVar3->list).d.size = (pQVar1->list).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar1 = this->d;
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (pQVar1 = this->d, pQVar1 != (QWritingSystemsPrivate *)0x0)) {
      pDVar2 = (pQVar1->list).d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((pQVar1->list).d.d)->super_QArrayData,1,0x10);
        }
      }
      operator_delete(pQVar1,0x20);
    }
    this->d = pQVar3;
  }
  return;
}

Assistant:

void QSupportedWritingSystems::detach()
{
    if (d->ref.loadRelaxed() != 1) {
        QWritingSystemsPrivate *newd = new QWritingSystemsPrivate(d);
        if (!d->ref.deref())
            delete d;
        d = newd;
    }
}